

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O1

UBool __thiscall
icu_63::CollationIterator::operator==(CollationIterator *this,CollationIterator *other)

{
  uint uVar1;
  char *__s1;
  char *__s2;
  long *plVar2;
  long *plVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  
  __s1 = *(char **)((this->super_UObject)._vptr_UObject[-1] + 8);
  __s2 = *(char **)((other->super_UObject)._vptr_UObject[-1] + 8);
  if ((__s1 == __s2) || ((*__s1 != '*' && (iVar5 = strcmp(__s1,__s2), iVar5 == 0)))) {
    uVar1 = (this->ceBuffer).length;
    if ((uVar1 == (other->ceBuffer).length) &&
       (((this->cesIndex == other->cesIndex && (this->numCpFwd == other->numCpFwd)) &&
        (this->isNumeric == other->isNumeric)))) {
      if ((int)uVar1 < 1) {
        return (int)uVar1 < 1;
      }
      plVar2 = (this->ceBuffer).buffer.ptr;
      plVar3 = (other->ceBuffer).buffer.ptr;
      if (*plVar2 != *plVar3) {
        return (int)uVar1 < 1;
      }
      uVar4 = 1;
      do {
        uVar6 = uVar4;
        if (uVar1 == uVar6) break;
        uVar4 = uVar6 + 1;
      } while (plVar2[uVar6] == plVar3[uVar6]);
      return uVar1 <= uVar6;
    }
  }
  return '\0';
}

Assistant:

UBool
CollationIterator::operator==(const CollationIterator &other) const {
    // Subclasses: Call this method and then add more specific checks.
    // Compare the iterator state but not the collation data (trie & data fields):
    // Assume that the caller compares the data.
    // Ignore skipped since that should be unused between calls to nextCE().
    // (It only stays around to avoid another memory allocation.)
    if(!(typeid(*this) == typeid(other) &&
            ceBuffer.length == other.ceBuffer.length &&
            cesIndex == other.cesIndex &&
            numCpFwd == other.numCpFwd &&
            isNumeric == other.isNumeric)) {
        return FALSE;
    }
    for(int32_t i = 0; i < ceBuffer.length; ++i) {
        if(ceBuffer.get(i) != other.ceBuffer.get(i)) { return FALSE; }
    }
    return TRUE;
}